

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O1

size_t qHash(QJsonArray *array,size_t seed)

{
  QCborContainerPrivate *pQVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (array->a).d.ptr;
  if (pQVar1 == (QCborContainerPrivate *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pQVar1->elements).d.size * 2;
  }
  if (lVar4 != 0) {
    lVar5 = 0;
    do {
      local_48 = (anon_union_8_3_4e90986c_for_QJsonValueConstRef_0)array;
      local_40 = lVar5;
      sVar2 = qHash<QJsonValueConstRef,_true>((QJsonValueConstRef *)&local_48,0);
      seed = seed ^ (seed >> 2) + seed * 0x40 + sVar2 + 0x9e3779b9;
      lVar3 = lVar5 + 2;
      lVar5 = lVar5 + 2;
    } while (lVar3 != lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return seed;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QJsonArray &array, size_t seed)
{
    return qHashRange(array.begin(), array.end(), seed);
}